

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O3

void __thiscall cmConfigureLog::~cmConfigureLog(cmConfigureLog *this)

{
  StreamWriter *pSVar1;
  pointer puVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  if (this->Opened == true) {
    if (this->Indent == 0) {
      __assert_fail("this->Indent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmConfigureLog.cxx"
                    ,0x87,"void cmConfigureLog::EndObject()");
    }
    this->Indent = this->Indent - 1;
    std::__ostream_insert<char,std::char_traits<char>>
              (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"...\n",4);
  }
  pSVar1 = (this->Encoder)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  if (pSVar1 != (StreamWriter *)0x0) {
    (*pSVar1->_vptr_StreamWriter[1])();
  }
  (this->Encoder)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  uVar5 = _EVP_PKEY_get_bn_param;
  pp_Var4 = _VTT;
  (this->Stream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = _VTT;
  *(undefined8 *)
   ((long)&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
   (long)pp_Var4[-3]) = uVar5;
  std::filebuf::~filebuf
            ((filebuf *)&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
            );
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  puVar2 = (this->LogVersions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->LogVersions).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->LogDir)._M_dataplus._M_p;
  paVar6 = &(this->LogDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar6) {
    operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmConfigureLog::~cmConfigureLog()
{
  if (this->Opened) {
    this->EndObject();
    this->Stream << "...\n";
  }
}